

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_sampled_image_pass.cpp
# Opt level: O2

Status __thiscall spvtools::opt::ConvertToSampledImagePass::Process(ConvertToSampledImagePass *this)

{
  bool bVar1;
  Status SVar2;
  iterator iVar3;
  Status SVar4;
  Status SVar5;
  Status SVar6;
  __node_base *p_Var7;
  __node_base *p_Var8;
  DescriptorSetBindingToInstruction descriptor_set_binding_pair_to_image;
  DescriptorSetBindingToInstruction descriptor_set_binding_pair_to_sampler;
  
  descriptor_set_binding_pair_to_sampler._M_h._M_buckets =
       &descriptor_set_binding_pair_to_sampler._M_h._M_single_bucket;
  descriptor_set_binding_pair_to_sampler._M_h._M_bucket_count = 1;
  descriptor_set_binding_pair_to_sampler._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  descriptor_set_binding_pair_to_sampler._M_h._M_element_count = 0;
  descriptor_set_binding_pair_to_sampler._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  descriptor_set_binding_pair_to_sampler._M_h._M_rehash_policy._M_next_resize = 0;
  descriptor_set_binding_pair_to_sampler._M_h._M_single_bucket = (__node_base_ptr)0x0;
  descriptor_set_binding_pair_to_image._M_h._M_buckets =
       &descriptor_set_binding_pair_to_image._M_h._M_single_bucket;
  descriptor_set_binding_pair_to_image._M_h._M_bucket_count = 1;
  descriptor_set_binding_pair_to_image._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  descriptor_set_binding_pair_to_image._M_h._M_element_count = 0;
  descriptor_set_binding_pair_to_image._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  descriptor_set_binding_pair_to_image._M_h._M_rehash_policy._M_next_resize = 0;
  descriptor_set_binding_pair_to_image._M_h._M_single_bucket = (__node_base_ptr)0x0;
  bVar1 = CollectResourcesToConvert
                    (this,&descriptor_set_binding_pair_to_sampler,
                     &descriptor_set_binding_pair_to_image);
  SVar4 = Failure;
  SVar5 = SVar4;
  if (bVar1) {
    p_Var7 = &descriptor_set_binding_pair_to_sampler._M_h._M_before_begin;
    p_Var8 = &descriptor_set_binding_pair_to_image._M_h._M_before_begin;
    SVar6 = SuccessWithoutChange;
    do {
      p_Var8 = p_Var8->_M_nxt;
      if (p_Var8 == (__node_base *)0x0) goto LAB_0049c990;
      SVar2 = UpdateImageVariableToSampledImage
                        (this,*(Instruction **)
                               &((_Prime_rehash_policy *)(p_Var8 + 2))->_M_max_load_factor,
                         (DescriptorSetAndBinding *)(p_Var8 + 1));
      if ((int)SVar2 < (int)SVar6) {
        SVar6 = SVar2;
      }
    } while (SVar6 != Failure);
  }
  goto LAB_0049c9ce;
  while( true ) {
    SVar2 = CheckUsesOfSamplerVariable
                      (this,*(Instruction **)
                             &((_Prime_rehash_policy *)(p_Var7 + 2))->_M_max_load_factor,
                       *(Instruction **)
                        ((long)iVar3.
                               super__Node_iterator_base<std::pair<const_spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*>,_true>
                               ._M_cur + 0x10));
    if ((int)SVar2 < (int)SVar6) {
      SVar6 = SVar2;
    }
    if (SVar6 == Failure) break;
LAB_0049c990:
    p_Var7 = p_Var7->_M_nxt;
    SVar5 = SVar6;
    if (((p_Var7 == (__node_base *)0x0) ||
        (iVar3 = std::
                 _Hashtable<spvtools::opt::DescriptorSetAndBinding,_std::pair<const_spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::DescriptorSetAndBinding>,_spvtools::opt::ConvertToSampledImagePass::DescriptorSetAndBindingHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&descriptor_set_binding_pair_to_image._M_h,(key_type *)(p_Var7 + 1)),
        SVar5 = SVar4,
        iVar3.
        super__Node_iterator_base<std::pair<const_spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*>,_true>
        ._M_cur == (__node_type *)0x0)) ||
       (SVar5 = Failure,
       *(Instruction **)
        ((long)iVar3.
               super__Node_iterator_base<std::pair<const_spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*>,_true>
               ._M_cur + 0x10) == (Instruction *)0x0)) break;
  }
LAB_0049c9ce:
  std::
  _Hashtable<spvtools::opt::DescriptorSetAndBinding,_std::pair<const_spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::DescriptorSetAndBinding>,_spvtools::opt::ConvertToSampledImagePass::DescriptorSetAndBindingHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&descriptor_set_binding_pair_to_image._M_h);
  std::
  _Hashtable<spvtools::opt::DescriptorSetAndBinding,_std::pair<const_spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::DescriptorSetAndBinding>,_spvtools::opt::ConvertToSampledImagePass::DescriptorSetAndBindingHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&descriptor_set_binding_pair_to_sampler._M_h);
  return SVar5;
}

Assistant:

Pass::Status ConvertToSampledImagePass::Process() {
  Status status = Status::SuccessWithoutChange;

  DescriptorSetBindingToInstruction descriptor_set_binding_pair_to_sampler,
      descriptor_set_binding_pair_to_image;
  if (!CollectResourcesToConvert(&descriptor_set_binding_pair_to_sampler,
                                 &descriptor_set_binding_pair_to_image)) {
    return Status::Failure;
  }

  for (auto& image : descriptor_set_binding_pair_to_image) {
    status = CombineStatus(
        status, UpdateImageVariableToSampledImage(image.second, image.first));
    if (status == Status::Failure) {
      return status;
    }
  }

  for (const auto& sampler : descriptor_set_binding_pair_to_sampler) {
    // Converting only a Sampler to Sampled Image is not allowed. It must have a
    // corresponding image to combine the sampler with.
    auto image_itr = descriptor_set_binding_pair_to_image.find(sampler.first);
    if (image_itr == descriptor_set_binding_pair_to_image.end() ||
        image_itr->second == nullptr) {
      return Status::Failure;
    }

    status = CombineStatus(
        status, CheckUsesOfSamplerVariable(sampler.second, image_itr->second));
    if (status == Status::Failure) {
      return status;
    }
  }

  return status;
}